

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_layered.c
# Opt level: O1

zip_source_t *
zip_source_layered_create
          (zip_source_t *src,zip_source_layered_callback cb,void *ud,zip_error_t *error)

{
  ulong uVar1;
  zip_source_t *pzVar2;
  zip_int64_t lower_supports;
  zip_int64_t local_38;
  
  local_38 = zip_source_supports(src);
  uVar1 = (*cb)(src,ud,&local_38,8,ZIP_SOURCE_SUPPORTS);
  if ((long)uVar1 < 0) {
    pzVar2 = (zip_source_t *)0x0;
    zip_error_set(error,0x12,0);
    (*cb)(src,ud,error,0x10,ZIP_SOURCE_ERROR);
  }
  else {
    pzVar2 = _zip_source_new(error);
    if (pzVar2 == (zip_source_t *)0x0) {
      pzVar2 = (zip_source_t *)0x0;
    }
    else {
      pzVar2->src = src;
      (pzVar2->cb).l = cb;
      pzVar2->ud = ud;
      pzVar2->supports = uVar1 & 0x7fffffffffff40ff;
    }
  }
  return pzVar2;
}

Assistant:

zip_source_t *
zip_source_layered_create(zip_source_t *src, zip_source_layered_callback cb, void *ud, zip_error_t *error) {
    zip_source_t *zs;
    zip_int64_t lower_supports, supports;

    lower_supports = zip_source_supports(src);
    supports = cb(src, ud, &lower_supports, sizeof(lower_supports), ZIP_SOURCE_SUPPORTS);
    if (supports < 0) {
        zip_error_set(error,ZIP_ER_INVAL, 0); /* Initialize in case cb doesn't return valid error. */
        cb(src, ud, error, sizeof(*error), ZIP_SOURCE_ERROR);
        return NULL;
    }

    if ((zs = _zip_source_new(error)) == NULL) {
        return NULL;
    }

    zs->src = src;
    zs->cb.l = cb;
    zs->ud = ud;
    zs->supports = supports;

    /* Layered sources can't support writing, since we currently have no use case. If we want to revisit this, we have to define how the two sources interact. */
    zs->supports &= ~(ZIP_SOURCE_SUPPORTS_WRITABLE & ~ZIP_SOURCE_SUPPORTS_SEEKABLE);

    return zs;
}